

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifParseInputs(Io_BlifMan_t *p,char *pLine)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Io_BlifObj_t *Entry;
  int local_34;
  int i;
  char *pToken;
  Io_BlifObj_t *pObj;
  char *pLine_local;
  Io_BlifMan_t *p_local;
  
  Io_BlifSplitIntoTokens(p->vTokens,pLine,'\0');
  pcVar3 = (char *)Vec_PtrEntry(p->vTokens,0);
  iVar1 = strcmp(pcVar3,"inputs");
  if (iVar1 != 0) {
    __assert_fail("!strcmp(pToken, \"inputs\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifAig.c"
                  ,0x284,"int Io_BlifParseInputs(Io_BlifMan_t *, char *)");
  }
  local_34 = 1;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vTokens);
    if (iVar1 <= local_34) {
      return 1;
    }
    pcVar3 = (char *)Vec_PtrEntry(p->vTokens,local_34);
    Entry = Io_BlifHashFindOrAdd(p,pcVar3);
    if (((undefined1  [32])*Entry & (undefined1  [32])0x1) != (undefined1  [32])0x0) break;
    *(uint *)Entry = *(uint *)Entry & 0xfffffffe | 1;
    Vec_PtrPush(p->vPis,Entry);
    local_34 = local_34 + 1;
  }
  uVar2 = Io_BlifGetLine(p,pcVar3);
  sprintf(p->sError,"Line %d: Primary input (%s) is defined more than once.",(ulong)uVar2,pcVar3);
  return 0;
}

Assistant:

static int Io_BlifParseInputs( Io_BlifMan_t * p, char * pLine )
{
    Io_BlifObj_t * pObj;
    char * pToken;
    int i;
    Io_BlifSplitIntoTokens( p->vTokens, pLine, '\0' );
    pToken = (char *)Vec_PtrEntry(p->vTokens, 0);
    assert( !strcmp(pToken, "inputs") );
    Vec_PtrForEachEntryStart( char *, p->vTokens, pToken, i, 1 )
    {
        pObj = Io_BlifHashFindOrAdd( p, pToken );
        if ( pObj->fPi )
        {
            sprintf( p->sError, "Line %d: Primary input (%s) is defined more than once.", Io_BlifGetLine(p, pToken), pToken );
            return 0;
        }
        pObj->fPi = 1;
        Vec_PtrPush( p->vPis, pObj );
    }
    return 1;
}